

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_ManAddNtk(Au_Man_t *pMan,Au_Ntk_t *p)

{
  int iVar1;
  char *pName;
  Au_Ntk_t *p_local;
  Au_Man_t *pMan_local;
  
  pName = Au_NtkName(p);
  iVar1 = Au_ManFindNtk(pMan,pName);
  if (iVar1 == -1) {
    p->pMan = pMan;
    pMan->nRefs = pMan->nRefs + 1;
    iVar1 = Vec_PtrSize(&pMan->vNtks);
    p->Id = iVar1;
    Vec_PtrPush(&pMan->vNtks,p);
    return;
  }
  __assert_fail("Au_ManFindNtk(pMan, Au_NtkName(p)) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                ,0x174,"void Au_ManAddNtk(Au_Man_t *, Au_Ntk_t *)");
}

Assistant:

void Au_ManAddNtk( Au_Man_t * pMan, Au_Ntk_t * p )
{
    assert( Au_ManFindNtk(pMan, Au_NtkName(p)) == -1 );
    p->pMan = pMan; pMan->nRefs++;
    p->Id = Vec_PtrSize( &pMan->vNtks );
    Vec_PtrPush( &pMan->vNtks, p );
}